

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_tests.cpp
# Opt level: O0

void result_tests::ExpectSuccess<bilingual_str,bilingual_str>
               (Result<bilingual_str> *result,bilingual_str *str,bilingual_str *args)

{
  bool bVar1;
  T *pTVar2;
  long in_FS_OFFSET;
  char *in_stack_fffffffffffffdc8;
  bilingual_str *in_stack_fffffffffffffdd0;
  bilingual_str *prev;
  char *in_stack_fffffffffffffdd8;
  T *in_stack_fffffffffffffdf0;
  size_t in_stack_fffffffffffffdf8;
  size_t line_num;
  const_string *in_stack_fffffffffffffe00;
  const_string *file;
  unit_test_log_t *in_stack_fffffffffffffe08;
  unit_test_log_t *this;
  bilingual_str *in_stack_fffffffffffffe50;
  Result<bilingual_str> *in_stack_fffffffffffffe58;
  bilingual_str local_150;
  unit_test_log_t local_110 [3];
  bool in_stack_ffffffffffffff0f;
  undefined1 local_f0 [16];
  undefined1 local_e0 [70];
  bilingual_str local_9a;
  bilingual_str local_48;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ExpectResult<bilingual_str>
            (in_stack_fffffffffffffe58,in_stack_ffffffffffffff0f,in_stack_fffffffffffffe50);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdd8,
               (pointer)in_stack_fffffffffffffdd0,(unsigned_long)in_stack_fffffffffffffdc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
               (const_string *)in_stack_fffffffffffffdf0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffdd0,(char (*) [1])in_stack_fffffffffffffdc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdd8,
               (pointer)in_stack_fffffffffffffdd0,(unsigned_long)in_stack_fffffffffffffdc8);
    local_9a.original._M_dataplus._M_p._1_1_ =
         util::Result<bilingual_str>::has_value((Result<bilingual_str> *)in_stack_fffffffffffffdc8);
    local_9a.original._M_dataplus._M_p._0_1_ = 1;
    in_stack_fffffffffffffdd8 = "true";
    in_stack_fffffffffffffdd0 = &local_9a;
    in_stack_fffffffffffffdc8 = "result.has_value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              ((undefined1 *)((long)&local_9a.original.field_2 + 2),
               (undefined1 *)((long)&local_9a.original._M_dataplus._M_p + 2),0x41,1,2,
               (undefined1 *)((long)&local_9a.original._M_dataplus._M_p + 1));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffdc8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdd8,
               (pointer)in_stack_fffffffffffffdd0,(unsigned_long)in_stack_fffffffffffffdc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
               (const_string *)in_stack_fffffffffffffdf0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffdd0,(char (*) [1])in_stack_fffffffffffffdc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdd8,
               (pointer)in_stack_fffffffffffffdd0,(unsigned_long)in_stack_fffffffffffffdc8);
    pTVar2 = util::Result<bilingual_str>::value((Result<bilingual_str> *)in_stack_fffffffffffffdd8);
    prev = &local_48;
    bilingual_str::bilingual_str
              ((bilingual_str *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    in_stack_fffffffffffffdd8 = "T{std::forward<Args>(args)...}";
    in_stack_fffffffffffffdc8 = "result.value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bilingual_str,bilingual_str>
              (local_e0,local_f0,0x42,1,2,pTVar2);
    bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffffdc8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffdc8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
    in_stack_fffffffffffffdd0 = prev;
  } while (bVar1);
  do {
    file = (const_string *)(local_110 + 2);
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdd8,(pointer)prev,
               (unsigned_long)in_stack_fffffffffffffdc8);
    this = local_110;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this,file,line_num,(const_string *)in_stack_fffffffffffffdf0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)prev,(char (*) [1])in_stack_fffffffffffffdc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdd8,(pointer)prev,
               (unsigned_long)in_stack_fffffffffffffdc8);
    in_stack_fffffffffffffdf0 =
         util::Result<bilingual_str>::value((Result<bilingual_str> *)in_stack_fffffffffffffdd8);
    local_150.original._M_string_length = (size_type)in_stack_fffffffffffffdf0;
    local_150.original._M_dataplus._M_p =
         (pointer)util::Result<bilingual_str>::operator*
                            ((Result<bilingual_str> *)in_stack_fffffffffffffdc8);
    in_stack_fffffffffffffdd8 = "&*result";
    prev = &local_150;
    in_stack_fffffffffffffdc8 = "&result.value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bilingual_str_const*,bilingual_str_const*>
              (&local_150.translated,&local_150.original.field_2,0x43,1,2,
               &local_150.original._M_string_length);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffdc8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ExpectSuccess(const util::Result<T>& result, const bilingual_str& str, Args&&... args)
{
    ExpectResult(result, true, str);
    BOOST_CHECK_EQUAL(result.has_value(), true);
    BOOST_CHECK_EQUAL(result.value(), T{std::forward<Args>(args)...});
    BOOST_CHECK_EQUAL(&result.value(), &*result);
}